

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartialsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes,int partitionIndex)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  iVar2 = this->gPatternPartitionsStartPatterns[partitionIndex];
  lVar20 = (long)iVar2;
  iVar3 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  if (iVar2 < iVar3) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      dVar21 = 1.0;
      iVar2 = this->kCategoryCount;
      if (0 < iVar2) {
        iVar4 = this->kPartialsPaddedStateCount;
        auVar25 = ZEXT864(0) << 0x40;
        iVar16 = 0;
        iVar14 = (int)lVar20 * iVar4;
        do {
          if (0 < this->kStateCount) {
            lVar18 = 0;
            do {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = destP[iVar14 + lVar18];
              lVar18 = lVar18 + 1;
              auVar26 = vmaxsd_avx(auVar26,auVar25._0_16_);
              auVar25 = ZEXT1664(auVar26);
            } while (this->kStateCount != (int)lVar18);
          }
          iVar16 = iVar16 + 1;
          iVar14 = iVar14 + this->kPaddedPatternCount * iVar4;
        } while (iVar16 != iVar2);
        uVar11 = vcmpsd_avx512f(auVar25._0_16_,ZEXT816(0),0);
        bVar12 = (bool)((byte)uVar11 & 1);
        dVar21 = (double)((ulong)bVar12 * 0x3ff0000000000000 + (ulong)!bVar12 * auVar25._0_8_);
        if (0 < iVar2) {
          auVar27._0_8_ = 1.0 / dVar21;
          auVar27._8_8_ = 0;
          iVar14 = this->kStateCount;
          iVar16 = this->kPaddedPatternCount;
          iVar15 = iVar4 * (int)lVar20;
          auVar25 = vpbroadcastq_avx512f();
          iVar17 = 0;
          auVar23 = vbroadcastsd_avx512f(auVar27);
          do {
            if (0 < iVar14) {
              uVar19 = 0;
              do {
                auVar24 = vpbroadcastq_avx512f();
                auVar24 = vporq_avx512f(auVar24,auVar22);
                uVar13 = vpcmpuq_avx512f(auVar24,auVar25,2);
                pdVar1 = destP + (long)iVar15 + uVar19;
                auVar24._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
                auVar24._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
                auVar24._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
                auVar24._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
                auVar24._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
                auVar24._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
                auVar24._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
                auVar24._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
                auVar24 = vmulpd_avx512f(auVar23,auVar24);
                pdVar1 = destP + (long)iVar15 + uVar19;
                bVar12 = (bool)((byte)uVar13 & 1);
                bVar5 = (bool)((byte)(uVar13 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar13 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar13 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar13 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar13 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar13 >> 6) & 1);
                *pdVar1 = (double)((ulong)bVar12 * auVar24._0_8_ | (ulong)!bVar12 * (long)*pdVar1);
                pdVar1[1] = (double)((ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * (long)pdVar1[1])
                ;
                pdVar1[2] = (double)((ulong)bVar6 * auVar24._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]
                                    );
                pdVar1[3] = (double)((ulong)bVar7 * auVar24._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]
                                    );
                pdVar1[4] = (double)((ulong)bVar8 * auVar24._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]
                                    );
                pdVar1[5] = (double)((ulong)bVar9 * auVar24._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]
                                    );
                pdVar1[6] = (double)((ulong)bVar10 * auVar24._48_8_ |
                                    (ulong)!bVar10 * (long)pdVar1[6]);
                pdVar1[7] = (double)((uVar13 >> 7) * auVar24._56_8_ |
                                    (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar1[7]);
                uVar19 = uVar19 + 8;
              } while ((iVar14 + 7U & 0xfffffff8) != uVar19);
            }
            iVar17 = iVar17 + 1;
            iVar15 = iVar15 + iVar4 * iVar16;
          } while (iVar17 != iVar2);
        }
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar20] = dVar21;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar21 = log(dVar21);
LAB_0012c5ee:
          cumulativeScaleFactors[lVar20] = dVar21 + cumulativeScaleFactors[lVar20];
        }
      }
      else {
        dVar21 = log(dVar21);
        scaleFactors[lVar20] = dVar21;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_0012c5ee;
      }
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartialsByPartition(REALTYPE* destP,
                                                                   REALTYPE* scaleFactors,
                                                                   REALTYPE* cumulativeScaleFactors,
                                                                   const int fillWithOnes,
                                                                   const int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    // TODO None of the code below has been optimized.
    for (int k = startPattern; k < endPattern; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}